

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

ctmbstr get_final_name(ctmbstr prog)

{
  size_t sVar1;
  size_t len;
  size_t i;
  ctmbstr ptStack_18;
  int c;
  ctmbstr name;
  ctmbstr prog_local;
  
  sVar1 = strlen(prog);
  ptStack_18 = prog;
  for (len = 0; len < sVar1; len = len + 1) {
    if (((prog[len] == '/') || (prog[len] == '\\')) && (prog[len + 1] != '\0')) {
      ptStack_18 = prog + len + 1;
    }
  }
  return ptStack_18;
}

Assistant:

static ctmbstr get_final_name( ctmbstr prog )
{
    ctmbstr name = prog;
    int c;
    size_t i;
    size_t len = strlen(prog);

    for (i = 0; i < len; i++)
    {
        c = prog[i];
        if ((( c == '/' ) || ( c == '\\' )) && prog[i+1])
        {
            name = &prog[i+1];
        }
    }

    return name;
}